

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StartsWithTestTest.cpp
# Opt level: O0

void __thiscall StartsWithTestTest::StartsWithTestTest(StartsWithTestTest *this)

{
  unique_ptr<oout::StartsWithTest,_std::default_delete<oout::StartsWithTest>_> local_48;
  unique_ptr<TestText,_std::default_delete<TestText>_> local_40;
  shared_ptr<oout::EqualTest> local_38;
  shared_ptr<const_oout::NamedTest> local_28;
  unique_ptr<oout::NamedTest,_std::default_delete<oout::NamedTest>_> local_18;
  StartsWithTestTest *local_10;
  StartsWithTestTest *this_local;
  
  local_10 = this;
  oout::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__StartsWithTestTest_00324a80;
  std::make_unique<oout::StartsWithTest,char_const(&)[7],char_const(&)[4]>
            ((char (*) [7])&local_48,(char (*) [4])"abcdef");
  std::
  make_unique<TestText,std::unique_ptr<oout::StartsWithTest,std::default_delete<oout::StartsWithTest>>>
            ((unique_ptr<oout::StartsWithTest,_std::default_delete<oout::StartsWithTest>_> *)
             &local_40);
  std::
  make_shared<oout::EqualTest,std::unique_ptr<TestText,std::default_delete<TestText>>,char_const(&)[8]>
            ((unique_ptr<TestText,_std::default_delete<TestText>_> *)&local_38,
             (char (*) [8])&local_40);
  std::make_shared<oout::NamedTest_const,char_const(&)[18],std::shared_ptr<oout::EqualTest>>
            ((char (*) [18])&local_28,(shared_ptr<oout::EqualTest> *)"Realy starts with");
  std::make_unique<oout::NamedTest,char_const(&)[19],std::shared_ptr<oout::NamedTest_const>>
            ((char (*) [19])&local_18,(shared_ptr<const_oout::NamedTest> *)"StartsWithTestTest");
  std::unique_ptr<oout::Test_const,std::default_delete<oout::Test_const>>::
  unique_ptr<oout::NamedTest,std::default_delete<oout::NamedTest>,void>
            ((unique_ptr<oout::Test_const,std::default_delete<oout::Test_const>> *)&this->tests,
             &local_18);
  std::unique_ptr<oout::NamedTest,_std::default_delete<oout::NamedTest>_>::~unique_ptr(&local_18);
  std::shared_ptr<const_oout::NamedTest>::~shared_ptr(&local_28);
  std::shared_ptr<oout::EqualTest>::~shared_ptr(&local_38);
  std::unique_ptr<TestText,_std::default_delete<TestText>_>::~unique_ptr(&local_40);
  std::unique_ptr<oout::StartsWithTest,_std::default_delete<oout::StartsWithTest>_>::~unique_ptr
            (&local_48);
  return;
}

Assistant:

StartsWithTestTest::StartsWithTestTest()
	: tests(
		make_unique<NamedTest>(
			"StartsWithTestTest",
			make_shared<const NamedTest>(
				"Realy starts with",
				make_shared<EqualTest>(
					make_unique<TestText>(
						make_unique<StartsWithTest>(
							"abcdef",
							"abc"
						)
					),
					"success"
				)
			)
		)
	)
{
}